

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCentroidalTotalMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *centroidalMomentumJacobian)

{
  FrameVelocityRepresentation FVar1;
  long lVar2;
  index_type iVar3;
  bool bVar4;
  long lVar5;
  Position *pPVar6;
  void *local_280 [3];
  Position com;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> local_250;
  Product<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
  local_228;
  Transform com_T_base_in_base;
  MatrixView<double> local_180;
  Rotation local_150 [288];
  
  if ((centroidalMomentumJacobian->m_rows == 6) &&
     (lVar2 = centroidalMomentumJacobian->m_cols, lVar5 = iDynTree::Model::getNrOfDOFs(),
     lVar2 == lVar5 + 6)) {
    local_180.m_storage = centroidalMomentumJacobian->m_storage;
    local_180.m_rows = centroidalMomentumJacobian->m_rows;
    local_180.m_cols = centroidalMomentumJacobian->m_cols;
    local_180.m_storageOrder = centroidalMomentumJacobian->m_storageOrder;
    local_180.m_innerStride = centroidalMomentumJacobian->m_innerStride;
    local_180.m_outerStride = centroidalMomentumJacobian->m_outerStride;
    bVar4 = getLinearAngularMomentumJacobian(this,&local_180);
    if (bVar4) {
      getCenterOfMassPosition((KinDynComputations *)&com);
      iDynTree::FreeFloatingPos::worldBasePos();
      pPVar6 = (Position *)iDynTree::Transform::getPosition();
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      FVar1 = this->pimpl->m_frameVelRepr;
      if (FVar1 == INERTIAL_FIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)&local_228);
        iDynTree::Transform::Transform(&com_T_base_in_base,local_150,(Position *)&local_228);
        iDynTree::Transform::asAdjointTransformWrench();
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        iVar3 = 1;
        local_228.m_rhs.m_stride.m_outer.m_value =
             local_228.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        local_228.m_rhs.m_stride.m_inner.m_value = iVar3;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          local_228.m_rhs.m_stride.m_outer.m_value = iVar3;
          local_228.m_rhs.m_stride.m_inner.m_value =
               local_228.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_228.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_150;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_280,&local_228);
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_250.m_stride.m_outer.m_value = iVar3;
        local_250.m_stride.m_inner.m_value =
             local_250.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_rows.m_value;
        if (centroidalMomentumJacobian->m_storageOrder != ColumnMajor) {
          local_250.m_stride.m_outer.m_value =
               local_250.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_cols.m_value;
          local_250.m_stride.m_inner.m_value = iVar3;
        }
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,Eigen::Matrix<double,6,_1,0,6,_1>>
                  (&local_250,(Matrix<double,_6,__1,_0,_6,__1> *)local_280);
      }
      else if (FVar1 == MIXED_REPRESENTATION) {
        iDynTree::Rotation::Identity();
        iDynTree::Position::operator-((Position *)&local_228,pPVar6);
        iDynTree::Transform::Transform(&com_T_base_in_base,local_150,(Position *)&local_228);
        iDynTree::Transform::asAdjointTransformWrench();
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        iVar3 = 1;
        local_228.m_rhs.m_stride.m_outer.m_value =
             local_228.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        local_228.m_rhs.m_stride.m_inner.m_value = iVar3;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          local_228.m_rhs.m_stride.m_outer.m_value = iVar3;
          local_228.m_rhs.m_stride.m_inner.m_value =
               local_228.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_228.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_150;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_280,&local_228);
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_250.m_stride.m_outer.m_value = iVar3;
        local_250.m_stride.m_inner.m_value =
             local_250.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_rows.m_value;
        if (centroidalMomentumJacobian->m_storageOrder != ColumnMajor) {
          local_250.m_stride.m_outer.m_value =
               local_250.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_cols.m_value;
          local_250.m_stride.m_inner.m_value = iVar3;
        }
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,Eigen::Matrix<double,6,_1,0,6,_1>>
                  (&local_250,(Matrix<double,_6,__1,_0,_6,__1> *)local_280);
      }
      else {
        if (FVar1 != BODY_FIXED_REPRESENTATION) {
          return false;
        }
        iDynTree::Rotation::Identity();
        iDynTree::Rotation::inverse();
        iDynTree::Position::operator-((Position *)local_280,pPVar6);
        iDynTree::Rotation::operator*((Rotation *)&local_250,(Position *)&local_228);
        iDynTree::Transform::Transform(&com_T_base_in_base,local_150,(Position *)&local_250);
        iDynTree::Transform::asAdjointTransformWrench();
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        local_228.m_rhs.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_250.m_stride.m_outer.m_value = 1;
        local_228.m_rhs.m_stride.m_outer.m_value =
             local_228.m_rhs.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
             .m_cols.m_value;
        local_228.m_rhs.m_stride.m_inner.m_value = local_250.m_stride.m_outer.m_value;
        if (centroidalMomentumJacobian->m_storageOrder == ColumnMajor) {
          local_228.m_rhs.m_stride.m_outer.m_value = local_250.m_stride.m_outer.m_value;
          local_228.m_rhs.m_stride.m_inner.m_value =
               local_228.m_rhs.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_228.m_lhs.
        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = (PointerType)local_150;
        Eigen::Matrix<double,6,-1,0,6,-1>::
        Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
                  ((Matrix<double,6,_1,0,6,_1> *)local_280,&local_228);
        bVar4 = centroidalMomentumJacobian->m_storageOrder == ColumnMajor;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_cols.m_value = centroidalMomentumJacobian->m_cols;
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_rows.m_value = centroidalMomentumJacobian->m_rows;
        local_250.m_stride.m_inner.m_value = local_250.m_stride.m_outer.m_value;
        if (bVar4) {
          local_250.m_stride.m_inner.m_value =
               local_250.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_rows.m_value;
        }
        local_250.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
        .m_data = centroidalMomentumJacobian->m_storage;
        if (!bVar4) {
          local_250.m_stride.m_outer.m_value =
               local_250.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
               .m_cols.m_value;
        }
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,Eigen::Matrix<double,6,_1,0,6,_1>>
                  (&local_250,(Matrix<double,_6,__1,_0,_6,__1> *)local_280);
      }
      free(local_280[0]);
      return true;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalTotalMomentumJacobian",
               "Wrong size in input centroidalMomentumJacobian");
  }
  return false;
}

Assistant:

bool KinDynComputations::getCentroidalTotalMomentumJacobian(MatrixView<double> centroidalMomentumJacobian)
{
    bool ok = (centroidalMomentumJacobian.rows() == 6)
        && (centroidalMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getCentroidalTotalMomentumJacobian",
                    "Wrong size in input centroidalMomentumJacobian");
        return false;
    }

    if (!getLinearAngularMomentumJacobian(centroidalMomentumJacobian))
    {
        return false;
    }

    // get CoM and base pose
    Position com = getCenterOfMassPosition();
    const Position& basePosition = pimpl->m_pos.worldBasePos().getPosition();
    const Rotation& A_R_B = pimpl->m_pos.worldBasePos().getRotation();

    switch (pimpl->m_frameVelRepr)
    {
    case BODY_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B). Here we want to
        // express the quantity in (G[B]).
        // J_G[B] = G[B]_X_B * J_B
        // where is G[B]_X_B is the adjoint wrench transformation

        Transform com_T_base_in_base(Rotation::Identity(), A_R_B.inverse() * (basePosition - com));

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_base.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case MIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (B[A]). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_B[A] * J_B[A]
        // where is G[A]_X_B[A] is the adjoint wrench transformation

        Transform com_T_base_in_inertial(Rotation::Identity(), basePosition - com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_base_in_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    case INERTIAL_FIXED_REPRESENTATION:
    {
        // The getLinearAngularMomentumJacobian returns a quantity expressed in (A). Here we want
        // to express the quantity in (G[A]).
        // J_G[A] = G[A]_X_A * J_A
        // where is G[A]_X_A is the adjoint wrench transformation
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);

        iDynTree::Transform com_T_inertial(Rotation::Identity(),  -com);

        // The eval() solves the Eigen aliasing problem
        toEigen(centroidalMomentumJacobian) = (toEigen(com_T_inertial.asAdjointTransformWrench()) * toEigen(centroidalMomentumJacobian)).eval();

        break;
    }

    default:
        assert(false);
        return false;
    }

    return true;
}